

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_2::InvertSSBOInPlaceCase::InvertSSBOInPlaceCase
          (InvertSSBOInPlaceCase *this,Context *context,char *name,char *description,int numValues,
          bool isSized,IVec3 *localSize,IVec3 *workSize)

{
  int i;
  long lVar1;
  undefined7 in_register_00000089;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,"Read and write same SSBO");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00b3b800;
  this->m_numValues = (int)description;
  this->m_isSized = SUB41(numValues,0);
  lVar1 = 0;
  do {
    (this->m_localSize).m_data[lVar1] = *(int *)(CONCAT71(in_register_00000089,isSized) + lVar1 * 4)
    ;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->m_workSize).m_data[lVar1] = localSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

InvertSSBOInPlaceCase (Context& context, const char* name, const char* description, int numValues, bool isSized, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_numValues	(numValues)
		, m_isSized		(isSized)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
		DE_ASSERT(m_numValues % (m_workSize[0]*m_workSize[1]*m_workSize[2]*m_localSize[0]*m_localSize[1]*m_localSize[2]) == 0);
	}